

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

size_type __thiscall serialization::xml_iarchive::load_sequence_start(xml_iarchive *this)

{
  iterator *piVar1;
  xml_attribute<char> *pxVar2;
  ulonglong uVar3;
  _Elt_pointer ppxVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  xml_node<char> *node;
  char *end;
  xml_node<char> *local_38;
  char *local_30;
  
  ppxVar4 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar4 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar4 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_38 = rapidxml::xml_node<char>::first_node(ppxVar4[-1],"sequence",0,true);
  if (local_38 == (xml_node<char> *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar5 = &PTR__exception_00120d50;
    pcVar7 = "expect sequence";
  }
  else {
    pxVar2 = rapidxml::xml_node<char>::first_attribute(local_38,"size",0,true);
    if (pxVar2 == (xml_attribute<char> *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar5 = &PTR__exception_00120d50;
      pcVar7 = "expect sequence size";
    }
    else {
      local_30 = (pxVar2->super_xml_base<char>).m_value;
      if (local_30 == (char *)0x0) {
        local_30 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      uVar3 = strtoull(local_30,&local_30,10);
      pcVar7 = (pxVar2->super_xml_base<char>).m_value;
      pcVar6 = pcVar7;
      pcVar8 = &rapidxml::xml_base<char>::nullstr()::zero;
      if (pcVar7 != (char *)0x0) {
        pcVar6 = (char *)(pxVar2->super_xml_base<char>).m_value_size;
        pcVar8 = pcVar7;
      }
      if (local_30 + -(long)pcVar8 == pcVar6) {
        ppxVar4 = (this->stack_).c.
                  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppxVar4 ==
            (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
          ::_M_push_back_aux<rapidxml::xml_node<char>const*const&>
                    ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                      *)&this->stack_,&local_38);
        }
        else {
          *ppxVar4 = local_38;
          piVar1 = &(this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        if ((size_type)uVar3 == 0) {
          local_38 = (xml_node<char> *)0x0;
        }
        else {
          ppxVar4 = (this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppxVar4 ==
              (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppxVar4 = (this->stack_).c.
                      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_38 = rapidxml::xml_node<char>::first_node(ppxVar4[-1],"item",0,true);
        }
        ppxVar4 = (this->stack_).c.
                  super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppxVar4 ==
            (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
          ::_M_push_back_aux<rapidxml::xml_node<char>const*const&>
                    ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                      *)&this->stack_,&local_38);
        }
        else {
          *ppxVar4 = local_38;
          piVar1 = &(this->stack_).c.
                    super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        return (size_type)uVar3;
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar5 = &PTR__exception_00120d50;
      pcVar7 = "bad sequence size";
    }
  }
  puVar5[1] = pcVar7;
  puVar5[2] = "load_sequence_start";
  __cxa_throw(puVar5,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

size_type load_sequence_start() const
    {
        serialization_trace trace(__func__, "xml");
        auto node = stack_.top()->first_node("sequence");
        if(node == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence");
        }
        auto attr = node->first_attribute("size");
        if(attr == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence size");
        }

        char *end = attr->value();
        size_type size = std::strtoull(attr->value(), &end, 10);
        if(end - attr->value() != attr->value_size())
        {
            throw_serialization_error(__func__, "bad sequence size");
        }

        stack_.push(node);
        node = (size == 0 ? nullptr : stack_.top()->first_node("item"));
        stack_.push(node);

        return size;
    }